

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t XXH3_len_0to16_64b(xxh_u8 *input,size_t len,xxh_u8 *secret,XXH64_hash_t seed)

{
  XXH64_hash_t XVar1;
  xxh_u64 xVar2;
  xxh_u64 xVar3;
  ulong in_RCX;
  ulong in_RSI;
  xxh_u8 *in_RDI;
  xxh_u8 *unaff_retaddr;
  XXH64_hash_t in_stack_00000008;
  size_t in_stack_fffffffffffffff8;
  
  if (in_RSI < 9) {
    if (in_RSI < 4) {
      if (in_RSI == 0) {
        xVar2 = XXH_readLE64((void *)0x12d0f6);
        xVar3 = XXH_readLE64((void *)0x12d109);
        XVar1 = XXH64_avalanche(in_RCX ^ xVar2 ^ xVar3);
      }
      else {
        XVar1 = XXH3_len_1to3_64b(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,in_RSI);
      }
    }
    else {
      XVar1 = XXH3_len_4to8_64b(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,in_RSI);
    }
  }
  else {
    XVar1 = XXH3_len_9to16_64b((xxh_u8 *)len,(size_t)secret,(xxh_u8 *)seed,in_stack_00000008);
  }
  return XVar1;
}

Assistant:

XXH_FORCE_INLINE XXH64_hash_t XXH3_len_0to16_64b(const xxh_u8* input,
                                                 size_t len,
                                                 const xxh_u8* secret,
                                                 XXH64_hash_t seed) {
  XXH_ASSERT(len <= 16);
  {
    if (XXH_likely(len > 8))
      return XXH3_len_9to16_64b(input, len, secret, seed);
    if (XXH_likely(len >= 4))
      return XXH3_len_4to8_64b(input, len, secret, seed);
    if (len) return XXH3_len_1to3_64b(input, len, secret, seed);
    return XXH64_avalanche(
        seed ^ (XXH_readLE64(secret + 56) ^ XXH_readLE64(secret + 64)));
  }
}